

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O1

Own<capnp::ClientHook,_std::nullptr_t> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,Array<capnp::PipelineOp> *ops)

{
  uint *puVar1;
  PromiseArena *pPVar2;
  undefined8 uVar3;
  Refcounted *refcounted;
  void *pvVar4;
  QueuedClient *this_00;
  long *in_RDX;
  ClientHook *extraout_RDX;
  undefined8 *puVar5;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar6;
  ArrayDisposer **ppAVar7;
  size_t newSize;
  byte *pbVar8;
  _func_int **pp_Var9;
  PipelineOp *pPVar10;
  Own<capnp::ClientHook,_std::nullptr_t> OVar11;
  ArrayPtr<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
  table;
  bool success;
  PromiseForResult<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_capability_c__:501:17),_kj::Own<capnp::PipelineHook>_>
  clientPromise;
  size_t pos;
  bool local_c9;
  undefined1 local_c8 [48];
  undefined8 local_98;
  TransformPromiseNodeBase *local_88;
  byte *local_80;
  ArrayDisposer **local_78;
  OwnPromiseNode local_70;
  undefined1 local_68 [40];
  StringPtr local_40;
  
  if (ops[2].ptr == (PipelineOp *)0x0) {
    ppAVar7 = &ops[2].disposer;
    local_40.content.ptr = (char *)*in_RDX;
    local_40.content.size_ = in_RDX[1];
    local_70.ptr = (PromiseNode *)
                   (((long)ops[3].ptr - (long)ops[2].disposer >> 3) * -0x3333333333333333);
    table.size_ = (size_t)ops[2].disposer;
    table.ptr = (Entry *)(ops + 4);
    kj::
    HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
    ::
    insert<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Entry,kj::ArrayPtr<capnp::PipelineOp>&>
              ((HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
                *)local_68,table,(size_t)local_70.ptr,(StringPtr *)local_70.ptr);
    if (local_68[0] ==
        (HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
         )0x1) {
      pPVar10 = (PipelineOp *)(*ppAVar7 + local_68._8_8_ * 5);
    }
    else {
      local_68._8_8_ = &local_c9;
      local_c9 = false;
      local_68[0] = (HashIndex<kj::HashMap<kj::Array<capnp::PipelineOp>,kj::Own<capnp::ClientHook,decltype(nullptr)>>::Callbacks>
                     )0x1;
      local_68._24_8_ = &local_70;
      local_68._16_8_ = ppAVar7;
      local_68._32_8_ = &local_40;
      kj::_::ForkHub<kj::Own<capnp::PipelineHook,_std::nullptr_t>_>::addBranch
                ((ForkHub<kj::Own<capnp::PipelineHook,_std::nullptr_t>_> *)local_c8);
      local_80 = (byte *)kj::_::HeapArrayDisposer::allocateImpl
                                   (8,0,in_RDX[1],(_func_void_void_ptr *)0x0,
                                    (_func_void_void_ptr *)0x0);
      uVar3 = local_c8._0_8_;
      pbVar8 = local_80;
      if (in_RDX[1] != 0) {
        puVar5 = (undefined8 *)*in_RDX;
        do {
          *(undefined8 *)pbVar8 = *puVar5;
          pbVar8 = pbVar8 + 8;
          puVar5 = puVar5 + 1;
        } while (puVar5 != (undefined8 *)(in_RDX[1] * 8 + *in_RDX));
      }
      pp_Var9 = (_func_int **)((long)pbVar8 - (long)local_80 >> 3);
      pPVar2 = ((PromiseArenaMember *)local_c8._0_8_)->arena;
      local_78 = ppAVar7;
      if (pPVar2 == (PromiseArena *)0x0 || (ulong)(local_c8._0_8_ - (long)pPVar2) < 0x38) {
        pvVar4 = operator_new(0x400);
        ppAVar7 = local_78;
        local_88 = (TransformPromiseNodeBase *)((long)pvVar4 + 0x3c8);
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (local_88,(OwnPromiseNode *)local_c8,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::PipelineHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:501:17)>
                   ::anon_class_24_1_ba1d6a12_for_func::operator());
        *(undefined ***)((long)pvVar4 + 0x3c8) = &PTR_destroy_006f7b70;
        *(byte **)((long)pvVar4 + 1000) = local_80;
        *(_func_int ***)((long)pvVar4 + 0x3f0) = pp_Var9;
        *(undefined8 **)((long)pvVar4 + 0x3f8) = &kj::_::HeapArrayDisposer::instance;
        *(void **)((long)pvVar4 + 0x3d0) = pvVar4;
      }
      else {
        ((PromiseArenaMember *)local_c8._0_8_)->arena = (PromiseArena *)0x0;
        local_88 = (TransformPromiseNodeBase *)
                   &((PromiseArenaMember *)(local_c8._0_8_ + -0x40))->arena;
        kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
                  (local_88,(OwnPromiseNode *)local_c8,
                   kj::_::
                   SimpleTransformPromiseNode<kj::Own<capnp::PipelineHook,_std::nullptr_t>,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/capability.c++:501:17)>
                   ::anon_class_24_1_ba1d6a12_for_func::operator());
        ((PromiseArenaMember *)(uVar3 + -0x40))->arena = (PromiseArena *)&PTR_destroy_006f7b70;
        ((PromiseArenaMember *)(uVar3 + -0x20))->arena = (PromiseArena *)local_80;
        ((PromiseArenaMember *)(uVar3 + -0x10))->_vptr_PromiseArenaMember = pp_Var9;
        ((PromiseArenaMember *)(uVar3 + -0x10))->arena =
             (PromiseArena *)&kj::_::HeapArrayDisposer::instance;
        ((PromiseArenaMember *)(uVar3 + -0x30))->_vptr_PromiseArenaMember = (_func_int **)pPVar2;
        ppAVar7 = local_78;
      }
      uVar3 = local_c8._0_8_;
      local_c8._8_8_ = local_88;
      if ((PromiseArenaMember *)local_c8._0_8_ != (PromiseArenaMember *)0x0) {
        local_c8._0_8_ = (PromiseArenaMember *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
      }
      local_c8._16_8_ = *in_RDX;
      local_c8._24_8_ = in_RDX[1];
      local_c8._32_8_ = in_RDX[2];
      *in_RDX = 0;
      in_RDX[1] = 0;
      this_00 = (QueuedClient *)operator_new(0x68);
      QueuedClient::QueuedClient
                (this_00,(Promise<kj::Own<capnp::ClientHook,_std::nullptr_t>_> *)(local_c8 + 8));
      uVar3 = local_c8._8_8_;
      local_c8._40_8_ = &this_00->super_Refcounted;
      puVar1 = &(this_00->super_Refcounted).refcount;
      *puVar1 = *puVar1 + 1;
      local_98 = this_00;
      if ((TransformPromiseNodeBase *)local_c8._8_8_ != (TransformPromiseNodeBase *)0x0) {
        local_c8._8_8_ = (TransformPromiseNodeBase *)0x0;
        kj::_::PromiseDisposer::dispose((PromiseArenaMember *)uVar3);
      }
      pPVar10 = (PipelineOp *)ops[3].size_;
      if (ops[3].ptr == pPVar10) {
        newSize = 4;
        if (pPVar10 != (PipelineOp *)*ppAVar7) {
          newSize = ((long)pPVar10 - (long)*ppAVar7 >> 3) * -0x6666666666666666;
        }
        kj::
        Vector<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
        ::setCapacity((Vector<kj::HashMap<kj::Array<capnp::PipelineOp>,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>::Entry>
                       *)ppAVar7,newSize);
      }
      pPVar10 = ops[3].ptr;
      *(undefined8 *)&pPVar10->type = local_c8._16_8_;
      *(undefined8 *)&pPVar10[1].type = local_c8._24_8_;
      *(undefined8 *)&pPVar10[2].type = local_c8._32_8_;
      *(undefined8 *)&pPVar10[3].type = local_c8._40_8_;
      *(QueuedClient **)&pPVar10[4].type = local_98;
      ops[3].ptr = pPVar10 + 5;
      local_98._0_1_ = false;
      local_98._1_3_ = 0;
      local_98._4_4_ = 0;
      local_c8._24_8_ = (EventLoop *)0x0;
      local_c8._16_8_ = (_func_int **)0x0;
      local_c9 = true;
      kj::_::
      Deferred<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.h:615:7)>
      ::~Deferred((Deferred<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_table_h:615:7)>
                   *)local_68);
    }
    (**(code **)(**(_func_int ***)&pPVar10[4].type + 0x20))(this);
    pCVar6 = extraout_RDX_00;
  }
  else {
    (**(code **)((long)*ops[2].ptr + 0x10))(this);
    pCVar6 = extraout_RDX;
  }
  OVar11.ptr = pCVar6;
  OVar11.disposer = (Disposer *)this;
  return OVar11;
}

Assistant:

kj::Own<ClientHook> QueuedPipeline::getPipelinedCap(kj::Array<PipelineOp>&& ops) {
  KJ_IF_SOME(r, redirect) {
    return r->getPipelinedCap(kj::mv(ops));
  } else {
    return clientMap.findOrCreate(ops.asPtr(), [&]() {
      auto clientPromise = promise.addBranch()
          .then([ops = KJ_MAP(op, ops) { return op; }](kj::Own<PipelineHook> pipeline) {
        return pipeline->getPipelinedCap(kj::mv(ops));
      });
      return kj::HashMap<kj::Array<PipelineOp>, kj::Own<ClientHook>>::Entry {
        kj::mv(ops), kj::refcounted<QueuedClient>(kj::mv(clientPromise))
      };
    })->addRef();
  }
}